

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly_from_poly3(poly *out,poly3 *in)

{
  uint local_40;
  int local_3c;
  uint i;
  uint shift;
  crypto_word_t word_a;
  crypto_word_t word_s;
  crypto_word_t *words_a;
  crypto_word_t *words_s;
  poly3 *in_local;
  poly *out_local;
  
  word_s = (crypto_word_t)&in->a;
  word_a = (in->s).v[0] ^ 0xffffffffffffffff;
  _i = ((poly2 *)word_s)->v[0];
  local_3c = 0;
  words_a = (crypto_word_t *)in;
  for (local_40 = 0; local_40 < 0x2bd; local_40 = local_40 + 1) {
    (out->field_0).v[local_40] = ((ushort)word_a & 1) - 1;
    (out->field_0).v[local_40] = (out->field_0).v[local_40] | (ushort)_i & 1;
    word_a = word_a >> 1;
    _i = _i >> 1;
    local_3c = local_3c + 1;
    if (local_3c == 0x40) {
      words_a = words_a + 1;
      word_s = word_s + 8;
      word_a = *words_a ^ 0xffffffffffffffff;
      _i = *(ulong *)word_s;
      local_3c = 0;
    }
  }
  poly_normalize(out);
  return;
}

Assistant:

static void poly_from_poly3(struct poly *out, const struct poly3 *in) {
  const crypto_word_t *words_s = in->s.v;
  const crypto_word_t *words_a = in->a.v;
  crypto_word_t word_s = ~(*words_s);
  crypto_word_t word_a = *words_a;
  unsigned shift = 0;

  for (unsigned i = 0; i < N; i++) {
    out->v[i] = (uint16_t)(word_s & 1) - 1;
    out->v[i] |= word_a & 1;
    word_s >>= 1;
    word_a >>= 1;
    shift++;

    if (shift == BITS_PER_WORD) {
      words_s++;
      words_a++;
      word_s = ~(*words_s);
      word_a = *words_a;
      shift = 0;
    }
  }

  poly_normalize(out);
}